

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fence.cpp
# Opt level: O2

void __thiscall
myvk::FenceGroup::Initialize
          (FenceGroup *this,
          vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
          *fences)

{
  pointer ppVVar1;
  pointer psVar2;
  long *plVar3;
  shared_ptr<myvk::Fence> *i;
  pointer psVar4;
  VkFence local_28;
  
  ppVVar1 = (this->m_fences).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_fences).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar1) {
    (this->m_fences).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1;
  }
  plVar3 = (long *)(**(code **)(*(long *)&((((fences->
                                             super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->super_DeviceObjectBase + 0x10))();
  this->m_device = *(VkDevice *)(*plVar3 + 0x268);
  psVar2 = (fences->
           super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (fences->
                super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1) {
    local_28 = ((psVar4->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_fence;
    std::vector<VkFence_T*,std::allocator<VkFence_T*>>::emplace_back<VkFence_T*>
              ((vector<VkFence_T*,std::allocator<VkFence_T*>> *)&this->m_fences,&local_28);
  }
  return;
}

Assistant:

void FenceGroup::Initialize(const std::vector<Ptr<Fence>> &fences) {
	m_fences.clear();
	m_device = fences.front()->GetDevicePtr()->GetHandle();
	for (const auto &i : fences)
		m_fences.push_back(i->GetHandle());
}